

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::QualifiedIdentifier::QualifiedIdentifier
          (QualifiedIdentifier *this,Context *c,IdentifierPath *path)

{
  SourceCodeText *pSVar1;
  Scope *pSVar2;
  pool_ptr<soul::AST::Expression> local_78;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_70;
  
  (this->super_Expression).super_Statement.super_ASTObject.objectType = QualifiedIdentifier;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object =
       pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pSVar2 = c->parentScope;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.location.data =
       (c->location).location.data;
  (this->super_Expression).super_Statement.super_ASTObject.context.parentScope = pSVar2;
  (this->super_Expression).kind = unknown;
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__QualifiedIdentifier_002f5f48;
  (this->pathSections).
  super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pathSections).
  super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pathSections).
  super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pathPrefix).pathSections.items = (Identifier *)(this->pathPrefix).pathSections.space;
  (this->pathPrefix).pathSections.numActive = 0;
  (this->pathPrefix).pathSections.numAllocated = 8;
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
            (&local_70,&path->pathSections);
  local_78.object = (Expression *)0x0;
  addToPath(this,(IdentifierPath *)&local_70,&local_78);
  local_70.numActive = 0;
  if ((8 < local_70.numAllocated) && (local_70.items != (Identifier *)0x0)) {
    operator_delete__(local_70.items);
  }
  return;
}

Assistant:

QualifiedIdentifier (const Context& c, IdentifierPath path)
            : Expression (ObjectType::QualifiedIdentifier, c, ExpressionKind::unknown)
        {
            addToPath (path, nullptr);
        }